

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-obj.c
# Opt level: O1

void project_object_handler_METEOR(project_object_handler_context_t *context)

{
  byte bVar1;
  object *poVar2;
  char *pcVar3;
  
  poVar2 = context->obj;
  bVar1 = poVar2->el_info[2].flags;
  if ((bVar1 & 1) != 0) {
    context->do_kill = true;
    pcVar3 = "burn up";
    if (poVar2->number == '\x01') {
      pcVar3 = "burns up";
    }
    context->note_kill = pcVar3;
    context->ignore = (_Bool)(bVar1 >> 1 & 1);
  }
  bVar1 = poVar2->el_info[3].flags;
  if ((bVar1 & 1) != 0) {
    context->do_kill = true;
    pcVar3 = "shatter";
    if (poVar2->number == '\x01') {
      pcVar3 = "shatters";
    }
    context->note_kill = pcVar3;
    context->ignore = (_Bool)(bVar1 >> 1 & 1);
  }
  return;
}

Assistant:

static void project_object_elemental(project_object_handler_context_t *context,
									 int element, const char *singular_verb,
									 const char *plural_verb)
{
	if (context->obj->el_info[element].flags & EL_INFO_HATES) {
		context->do_kill = true;
		context->note_kill = VERB_AGREEMENT(context->obj->number,
											singular_verb, plural_verb);
		context->ignore = (context->obj->el_info[element].flags &
						   EL_INFO_IGNORE) ? true : false;
	}
}